

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  Fts5FullTable *pTab;
  Fts5Config *pFVar1;
  sqlite3_vtab *zName;
  u8 *pStmt;
  int iVar2;
  u32 nData;
  sqlite3_value *pValue;
  char *pcVar3;
  sqlite3_vtab *psVar4;
  Fts5Auxiliary *pFVar5;
  sqlite3_module *psVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Vdbe *pVm;
  long lVar10;
  int iVar11;
  int local_6c;
  u8 *dummy;
  int nByte;
  Fts5Buffer val;
  
  pTab = (Fts5FullTable *)pCursor->pVtab;
  pFVar1 = (pTab->p).pConfig;
  iVar9 = *(int *)&pCursor[4].pVtab;
  iVar7 = pFVar1->nCol;
  if (iVar9 == 3) {
    if (iVar7 == iCol) {
      sqlite3_result_int64(pCtx,(i64)pCursor[0xb].pVtab);
      return 0;
    }
    return 0;
  }
  if (iVar7 == iCol) {
    sqlite3_result_int64(pCtx,(i64)pCursor[3].pVtab);
    return 0;
  }
  if (iVar7 + 1 != iCol) {
    if (pFVar1->eContent == 1) {
      return 0;
    }
    iVar9 = fts5SeekCursor((Fts5Cursor *)pCursor,1);
    if (iVar9 == 0) {
      pValue = sqlite3_column_value((sqlite3_stmt *)pCursor[7].pVtab,iCol + 1);
      sqlite3_result_value(pCtx,pValue);
      return 0;
    }
    return iVar9;
  }
  if ((iVar9 != 1) && (iVar9 != 4)) {
    if (iVar9 == 2) {
      if (pCursor[8].pVtab == (sqlite3_vtab *)0x0) {
        iVar9 = 0;
      }
      else {
        iVar9 = *(int *)((long)&pCursor[8].pVtab[1].pModule + 4);
      }
      val.p = (u8 *)0x0;
      val.n = 0;
      val.nSpace = 0;
      if (pFVar1->eDetail == 0) {
        iVar7 = 1;
        if (1 < iVar9) {
          iVar7 = iVar9;
        }
        for (iVar11 = 0; iVar7 + -1 != iVar11; iVar11 = iVar11 + 1) {
          iVar2 = sqlite3Fts5ExprPoslist((Fts5Expr *)pCursor[8].pVtab,iVar11,&dummy);
          sqlite3Fts5BufferAppendVarint(&local_6c,&val,(long)iVar2);
        }
        iVar7 = 0;
        if (iVar9 < 1) {
          iVar9 = iVar7;
        }
        for (; iVar9 != iVar7; iVar7 = iVar7 + 1) {
          nData = sqlite3Fts5ExprPoslist((Fts5Expr *)pCursor[8].pVtab,iVar7,&dummy);
          sqlite3Fts5BufferAppendBlob(&local_6c,&val,nData,(u8 *)CONCAT44(dummy._4_4_,(int)dummy));
        }
      }
      else if (pFVar1->eDetail == 2) {
        iVar7 = 0;
        for (iVar11 = 0; (iVar7 == 0 && (iVar11 < iVar9 + -1)); iVar11 = iVar11 + 1) {
          local_6c = sqlite3Fts5ExprPhraseCollist((Fts5Expr *)pCursor[8].pVtab,iVar11,&dummy,&nByte)
          ;
          sqlite3Fts5BufferAppendVarint(&local_6c,&val,(long)nByte);
          iVar7 = local_6c;
        }
        for (iVar11 = 0; (iVar7 == 0 && (iVar11 < iVar9)); iVar11 = iVar11 + 1) {
          local_6c = sqlite3Fts5ExprPhraseCollist((Fts5Expr *)pCursor[8].pVtab,iVar11,&dummy,&nByte)
          ;
          sqlite3Fts5BufferAppendBlob(&local_6c,&val,nByte,(u8 *)CONCAT44(dummy._4_4_,(int)dummy));
          iVar7 = local_6c;
        }
      }
      sqlite3_result_blob(pCtx,val.p,val.n,sqlite3_free);
      return 0;
    }
    return 0;
  }
  pFVar5 = (Fts5Auxiliary *)pCursor[0xe].pVtab;
  if (pFVar5 == (Fts5Auxiliary *)0x0) {
    dummy._0_4_ = 0;
    zName = pCursor[0xc].pVtab;
    if (pCursor[0xd].pVtab != (sqlite3_vtab *)0x0) {
      pcVar3 = sqlite3Fts5Mprintf((int *)&dummy,"SELECT %s");
      iVar9 = (int)dummy;
      if (pcVar3 != (char *)0x0) {
        val.p = (u8 *)0x0;
        iVar9 = sqlite3_prepare_v3(pFVar1->db,pcVar3,-1,1,(sqlite3_stmt **)&val,(char **)0x0);
        dummy._0_4_ = iVar9;
        sqlite3_free(pcVar3);
        pStmt = val.p;
        if (iVar9 == 0) {
          iVar9 = sqlite3_step((sqlite3_stmt *)val.p);
          if (iVar9 == 100) {
            if (pStmt == (u8 *)0x0) {
              uVar8 = 0;
            }
            else {
              uVar8 = (uint)*(ushort *)(pStmt + 0xc0);
            }
            *(uint *)&pCursor[0xf].pVtab = uVar8;
            psVar4 = (sqlite3_vtab *)sqlite3Fts5MallocZero((int *)&dummy,(ulong)(uVar8 << 3));
            iVar9 = (int)dummy;
            pCursor[0x10].pVtab = psVar4;
            if ((int)dummy == 0) {
              for (lVar10 = 0; lVar10 < *(int *)&pCursor[0xf].pVtab; lVar10 = lVar10 + 1) {
                psVar6 = (sqlite3_module *)sqlite3_column_value((sqlite3_stmt *)pStmt,(int)lVar10);
                (&(pCursor[0x10].pVtab)->pModule)[lVar10] = psVar6;
              }
            }
            pCursor[0x11].pVtab = (sqlite3_vtab *)pStmt;
          }
          else {
            iVar9 = sqlite3_finalize((sqlite3_stmt *)pStmt);
          }
        }
      }
      if (iVar9 != 0) goto LAB_0018916b;
    }
    pFVar5 = fts5FindAuxiliary(pTab,(char *)zName);
    if (pFVar5 == (Fts5Auxiliary *)0x0) {
      pcVar3 = sqlite3_mprintf("no such function: %s",zName);
      (pTab->p).base.zErrMsg = pcVar3;
      iVar9 = 1;
LAB_0018916b:
      pCursor[0xe].pVtab = (sqlite3_vtab *)0x0;
      return iVar9;
    }
    pCursor[0xe].pVtab = (sqlite3_vtab *)pFVar5;
  }
  pCursor[0x12].pVtab = (sqlite3_vtab *)pFVar5;
  (*pFVar5->xFunc)(&sFts5Api,(Fts5Context *)pCursor,pCtx,*(int *)&pCursor[0xf].pVtab,
                   (sqlite3_value **)pCursor[0x10].pVtab);
  pCursor[0x12].pVtab = (sqlite3_vtab *)0x0;
  return 0;
}

Assistant:

static int fts5ColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts5FullTable *pTab = (Fts5FullTable*)(pCursor->pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc = SQLITE_OK;
  
  assert( CsrFlagTest(pCsr, FTS5CSR_EOF)==0 );

  if( pCsr->ePlan==FTS5_PLAN_SPECIAL ){
    if( iCol==pConfig->nCol ){
      sqlite3_result_int64(pCtx, pCsr->iSpecial);
    }
  }else

  if( iCol==pConfig->nCol ){
    /* User is requesting the value of the special column with the same name
    ** as the table. Return the cursor integer id number. This value is only
    ** useful in that it may be passed as the first argument to an FTS5
    ** auxiliary function.  */
    sqlite3_result_int64(pCtx, pCsr->iCsrId);
  }else if( iCol==pConfig->nCol+1 ){

    /* The value of the "rank" column. */
    if( pCsr->ePlan==FTS5_PLAN_SOURCE ){
      fts5PoslistBlob(pCtx, pCsr);
    }else if( 
        pCsr->ePlan==FTS5_PLAN_MATCH
     || pCsr->ePlan==FTS5_PLAN_SORTED_MATCH
    ){
      if( pCsr->pRank || SQLITE_OK==(rc = fts5FindRankFunction(pCsr)) ){
        fts5ApiInvoke(pCsr->pRank, pCsr, pCtx, pCsr->nRankArg, pCsr->apRankArg);
      }
    }
  }else if( !fts5IsContentless(pTab) ){
    rc = fts5SeekCursor(pCsr, 1);
    if( rc==SQLITE_OK ){
      sqlite3_result_value(pCtx, sqlite3_column_value(pCsr->pStmt, iCol+1));
    }
  }
  return rc;
}